

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

TypedExpectation<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::JoinerType)>
* __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::JoinerType)>
::FindMatchingExpectationLocked
          (FunctionMocker<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::JoinerType)>
           *this,ArgumentTuple *args)

{
  element_type *this_00;
  bool bVar1;
  __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
  __tmp;
  pointer psVar2;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  psVar2 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar2 == (this->super_UntypedFunctionMockerBase).untyped_expectations_.
                  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return (TypedExpectation<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::JoinerType)>
              *)(element_type *)0x0;
    }
    this_00 = psVar2[-1].
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    psVar2 = psVar2 + -1;
    bVar1 = TypedExpectation<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::JoinerType)>
            ::ShouldHandleArguments
                      ((TypedExpectation<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::JoinerType)>
                        *)this_00,args);
  } while (!bVar1);
  return (TypedExpectation<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::JoinerType)>
          *)this_00;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    // See the definition of untyped_expectations_ for why access to
    // it is unprotected here.
    for (typename UntypedExpectations::const_reverse_iterator it =
             untyped_expectations_.rbegin();
         it != untyped_expectations_.rend(); ++it) {
      TypedExpectation<F>* const exp =
          static_cast<TypedExpectation<F>*>(it->get());
      if (exp->ShouldHandleArguments(args)) {
        return exp;
      }
    }
    return nullptr;
  }